

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestNoTailForwarder::hold(TestNoTailForwarder *this,HoldContext context)

{
  Coroutine<void> *this_00;
  Client *__return_storage_ptr__;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  *__return_storage_ptr___00;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  *this_01;
  PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
  *__return_storage_ptr___01;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  *__return_storage_ptr___02;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  *this_02;
  PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
  *__return_storage_ptr___03;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> handle;
  size_t in_RCX;
  undefined8 in_RDX;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  undefined1 local_80 [16];
  void *local_70;
  PromiseBase local_50;
  undefined1 local_48 [24];
  
  handle._M_fr_ptr = operator_new(0x7d8);
  *(code **)handle._M_fr_ptr = hold;
  *(code **)((long)handle._M_fr_ptr + 8) = hold;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  *(CallContextHook **)((long)handle._M_fr_ptr + 0x7c8) = context.hook;
  *(undefined8 *)((long)handle._M_fr_ptr + 0x7c0) = in_RDX;
  local_80._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  local_80._8_8_ = "hold";
  local_70 = (void *)0x1500000854;
  location.function = "hold";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  location.lineNumber = 0x854;
  location.columnNumber = 0x15;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  local_50.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::getParams((Reader *)local_80,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
               *)((long)handle._M_fr_ptr + 0x7c0));
  __return_storage_ptr__ = (Client *)((long)handle._M_fr_ptr + 0x778);
  capnproto_test::capnp::test::TestMoreStuff::HoldParams::Reader::getCap
            (__return_storage_ptr__,(Reader *)local_80);
  if (*(char *)&context.hook[4]._vptr_CallContextHook == '\x01') {
    __return_storage_ptr___00 =
         (Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
          *)((long)handle._M_fr_ptr + 0x6a8);
    (((Maybe<capnp::MessageSize> *)((long)handle._M_fr_ptr + 0x790))->ptr).isSet = false;
    capnproto_test::capnp::test::TestMoreStuff::Client::echoRequest
              (__return_storage_ptr___00,(Client *)(context.hook + 5),
               (Maybe<capnp::MessageSize> *)((long)handle._M_fr_ptr + 0x790));
    Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>
              ((Client *)local_80,
               (Client *)
               ((long)&__return_storage_ptr__->_vptr_Client +
               (long)__return_storage_ptr__->_vptr_Client[-3]));
    capnproto_test::capnp::test::TestMoreStuff::EchoParams::Builder::setCap
              ((Builder *)__return_storage_ptr___00,(Client *)local_80);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_80 + 8));
    this_01 = (Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
               *)((long)handle._M_fr_ptr + 0x718);
    Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
    ::send(this_01,(int)__return_storage_ptr___00,__buf,in_RCX,in_R8D);
    __return_storage_ptr___01 =
         (PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
          *)((long)handle._M_fr_ptr + 0x238);
    co_await<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>>
              (__return_storage_ptr___01,
               (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_> *
               )this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 2000) = 0;
    bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr___01,(CoroutineBase *)this_00);
    if (bVar1) {
      return (Promise<void>)(PromiseNode *)local_50.node.ptr;
    }
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
    ::await_resume((Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *)
                   ((long)handle._M_fr_ptr + 0x628),__return_storage_ptr___01);
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
    ::~PromiseAwaiter(__return_storage_ptr___01);
    RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults>::~RemotePromise
              ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *)this_01);
    capnproto_test::capnp::test::TestMoreStuff::EchoResults::Reader::getCap
              ((Client *)local_48,(Reader *)((long)handle._M_fr_ptr + 0x628));
    Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>
              ((Client *)local_80,
               (Client *)
               (*(_func_int **)(local_48._0_8_ + -0x18) + (long)&((Client *)local_48)->_vptr_Client)
              );
    capnproto_test::capnp::test::TestInterface::Client::operator=
              (__return_storage_ptr__,(Client *)local_80);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_80 + 8));
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_48 + 8));
    kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose
              ((Own<capnp::ResponseHook,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x658));
    kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
              ((Own<capnp::RequestHook,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x6d0));
  }
  __return_storage_ptr___02 =
       (Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
        *)((long)handle._M_fr_ptr + 0x6e0);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x7a8) = 0;
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
            (__return_storage_ptr___02,(Client *)(*(long *)((long)handle._M_fr_ptr + 0x7c8) + 8),
             (Maybe<capnp::MessageSize> *)((long)handle._M_fr_ptr + 0x7a8));
  capnproto_test::capnp::test::TestMoreStuff::HoldParams::Builder::setCap
            ((Builder *)__return_storage_ptr___02,__return_storage_ptr__);
  this_02 = (Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
             *)((long)handle._M_fr_ptr + 0x748);
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send(this_02,(int)__return_storage_ptr___02,__buf_00,in_RCX,in_R8D);
  __return_storage_ptr___03 =
       (PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *)
       ((long)handle._M_fr_ptr + 0x430);
  co_await<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>>
            (__return_storage_ptr___03,
             (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *)
             this_02);
  *(undefined1 *)((long)handle._M_fr_ptr + 2000) = 1;
  bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr___03,(CoroutineBase *)this_00);
  if (!bVar1) {
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
    ::await_resume((Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)
                   ((long)handle._M_fr_ptr + 0x668),__return_storage_ptr___03);
    kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose
              ((Own<capnp::ResponseHook,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x698));
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
    ::~PromiseAwaiter(__return_storage_ptr___03);
    RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::~RemotePromise
              ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)this_02);
    kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
              ((Own<capnp::RequestHook,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x708));
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x780));
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 2000) = 2;
  }
  return (Promise<void>)(PromiseNode *)local_50.node.ptr;
}

Assistant:

kj::Promise<void> hold(HoldContext context) override {
    auto cap = context.getParams().getCap();

    // If we have a holdBouncer, bounce the capability through it first before forwarding on.
    KJ_IF_SOME(hb, holdBouncer) {
      auto req = hb.echoRequest();

      // HACK: echo() just reflects the cap back, but it was written to expect TestCallOrder
      //   specifically. We'll just pretend that's what we have, it doesn't matter.
      // TODO(cleanup): Change echo() to take `Capability` or maybe even be a generic.
      req.setCap(cap.castAs<test::TestCallOrder>());
      auto resp = co_await req.send();
      cap = resp.getCap().castAs<test::TestInterface>();
    }

    auto req = next.holdRequest();
    req.setCap(kj::mv(cap));
    co_await req.send();

    // (hold() has no results)
  }